

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inversion.hpp
# Opt level: O2

void __thiscall OpenMD::Inversion::~Inversion(Inversion *this)

{
  (this->super_ShortRangeInteraction)._vptr_ShortRangeInteraction =
       (_func_int **)&PTR__Inversion_002bd308;
  std::__cxx11::string::~string((string *)&this->name_);
  ShortRangeInteraction::~ShortRangeInteraction(&this->super_ShortRangeInteraction);
  return;
}

Assistant:

virtual ~Inversion() {}